

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::ValidationState_t::RegisterFunctionEnd(ValidationState_t *this)

{
  bool bVar1;
  Function *this_00;
  
  if (this->in_function_ == false) {
    __assert_fail("in_function_body() == true && \"RegisterFunctionEnd can only be called when parsing the binary \" \"inside of another function\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x207,"spv_result_t spvtools::val::ValidationState_t::RegisterFunctionEnd()");
  }
  bVar1 = in_block(this);
  if (!bVar1) {
    this_00 = current_function(this);
    Function::RegisterFunctionEnd(this_00);
    this->in_function_ = false;
    return SPV_SUCCESS;
  }
  __assert_fail("in_block() == false && \"RegisterFunctionParameter can only be called when parsing the binary \" \"outside of a block\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                ,0x20a,"spv_result_t spvtools::val::ValidationState_t::RegisterFunctionEnd()");
}

Assistant:

spv_result_t ValidationState_t::RegisterFunctionEnd() {
  assert(in_function_body() == true &&
         "RegisterFunctionEnd can only be called when parsing the binary "
         "inside of another function");
  assert(in_block() == false &&
         "RegisterFunctionParameter can only be called when parsing the binary "
         "outside of a block");
  current_function().RegisterFunctionEnd();
  in_function_ = false;
  return SPV_SUCCESS;
}